

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unixUnlock(unqlite_file *id,int eFileLock)

{
  _func_int_unqlite_file_ptr_void_ptr_unqlite_int64_unqlite_int64 **pp_Var1;
  unqlite_io_methods *puVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  int iVar6;
  
  if ((int)(uint)*(byte *)&id[3].pMethods <= eFileLock) {
    return 0;
  }
  iVar4 = *(int *)&id[2].pMethods;
  puVar2 = id[1].pMethods;
  if (*(byte *)&id[3].pMethods < 2) {
LAB_0010fde7:
    if (eFileLock != 0) goto LAB_0010fe9b;
    iVar3 = 0;
    pp_Var1 = &puVar2->xRead;
    *(int *)pp_Var1 = *(int *)pp_Var1 + -1;
    if (*(int *)pp_Var1 == 0) {
      iVar3 = 0;
      iVar6 = 6;
      iVar4 = fcntl(iVar4,6);
      if (iVar4 == -1) {
        piVar5 = __errno_location();
        iVar4 = *piVar5;
        iVar3 = unqliteErrorFromPosixError(iVar4,iVar6);
        if ((iVar3 != -0xe) && (iVar3 != 0)) {
          *(int *)((long)&id[3].pMethods + 4) = iVar4;
        }
        *(undefined4 *)((long)&puVar2->xRead + 4) = 0;
        *(undefined1 *)&id[3].pMethods = 0;
      }
      else {
        *(undefined4 *)((long)&puVar2->xRead + 4) = 0;
      }
    }
    piVar5 = (int *)((long)&puVar2->xWrite + 4);
    *piVar5 = *piVar5 + -1;
    if ((*piVar5 == 0) && (iVar4 = closePendingFds((unixFile *)id), iVar3 == 0)) {
      iVar3 = iVar4;
    }
  }
  else {
    if (eFileLock == 1) {
      iVar6 = 6;
      iVar3 = fcntl(iVar4,6);
      if (iVar3 != -1) goto LAB_0010fdb1;
    }
    else {
LAB_0010fdb1:
      iVar6 = 6;
      iVar3 = fcntl(iVar4,6);
      if (iVar3 != -1) {
        *(undefined4 *)((long)&puVar2->xRead + 4) = 1;
        goto LAB_0010fde7;
      }
    }
    piVar5 = __errno_location();
    iVar4 = *piVar5;
    iVar3 = unqliteErrorFromPosixError(iVar4,iVar6);
    if ((iVar3 != -0xe) && (iVar3 != 0)) {
      *(int *)((long)&id[3].pMethods + 4) = iVar4;
      return iVar3;
    }
  }
  if (iVar3 != 0) {
    return iVar3;
  }
LAB_0010fe9b:
  *(char *)&id[3].pMethods = (char)eFileLock;
  return 0;
}

Assistant:

static int _posixUnlock(unqlite_file *id, int eFileLock, int handleNFSUnlock){
  unixFile *pFile = (unixFile*)id;
  unixInodeInfo *pInode;
  struct flock lock;
  int rc = UNQLITE_OK;
  int h;
  int tErrno;                      /* Error code from system call errors */

   if( pFile->eFileLock<=eFileLock ){
    return UNQLITE_OK;
  }
  unixEnterMutex();
  
  h = pFile->h;
  pInode = pFile->pInode;
  
  if( pFile->eFileLock>SHARED_LOCK ){
    /* downgrading to a shared lock on NFS involves clearing the write lock
    ** before establishing the readlock - to avoid a race condition we downgrade
    ** the lock in 2 blocks, so that part of the range will be covered by a 
    ** write lock until the rest is covered by a read lock:
    **  1:   [WWWWW]
    **  2:   [....W]
    **  3:   [RRRRW]
    **  4:   [RRRR.]
    */
    if( eFileLock==SHARED_LOCK ){
      if( handleNFSUnlock ){
        off_t divSize = SHARED_SIZE - 1;
        
        lock.l_type = F_UNLCK;
        lock.l_whence = SEEK_SET;
        lock.l_start = SHARED_FIRST;
        lock.l_len = divSize;
        if( fcntl(h, F_SETLK, &lock)==(-1) ){
          tErrno = errno;
		  rc = unqliteErrorFromPosixError(tErrno, UNQLITE_LOCKERR);
          if( IS_LOCK_ERROR(rc) ){
            pFile->lastErrno = tErrno;
          }
          goto end_unlock;
        }
        lock.l_type = F_RDLCK;
        lock.l_whence = SEEK_SET;
        lock.l_start = SHARED_FIRST;
        lock.l_len = divSize;
        if( fcntl(h, F_SETLK, &lock)==(-1) ){
          tErrno = errno;
		  rc = unqliteErrorFromPosixError(tErrno, UNQLITE_LOCKERR);
          if( IS_LOCK_ERROR(rc) ){
            pFile->lastErrno = tErrno;
          }
          goto end_unlock;
        }
        lock.l_type = F_UNLCK;
        lock.l_whence = SEEK_SET;
        lock.l_start = SHARED_FIRST+divSize;
        lock.l_len = SHARED_SIZE-divSize;
        if( fcntl(h, F_SETLK, &lock)==(-1) ){
          tErrno = errno;
		  rc = unqliteErrorFromPosixError(tErrno, UNQLITE_LOCKERR);
          if( IS_LOCK_ERROR(rc) ){
            pFile->lastErrno = tErrno;
          }
          goto end_unlock;
        }
      }else{
        lock.l_type = F_RDLCK;
        lock.l_whence = SEEK_SET;
        lock.l_start = SHARED_FIRST;
        lock.l_len = SHARED_SIZE;
        if( fcntl(h, F_SETLK, &lock)==(-1) ){
          tErrno = errno;
		  rc = unqliteErrorFromPosixError(tErrno, UNQLITE_LOCKERR);
          if( IS_LOCK_ERROR(rc) ){
            pFile->lastErrno = tErrno;
          }
          goto end_unlock;
        }
      }
    }
    lock.l_type = F_UNLCK;
    lock.l_whence = SEEK_SET;
    lock.l_start = PENDING_BYTE;
    lock.l_len = 2L;
    if( fcntl(h, F_SETLK, &lock)!=(-1) ){
      pInode->eFileLock = SHARED_LOCK;
    }else{
      tErrno = errno;
	  rc = unqliteErrorFromPosixError(tErrno, UNQLITE_LOCKERR);
      if( IS_LOCK_ERROR(rc) ){
        pFile->lastErrno = tErrno;
      }
      goto end_unlock;
    }
  }
  if( eFileLock==NO_LOCK ){
    /* Decrement the shared lock counter.  Release the lock using an
    ** OS call only when all threads in this same process have released
    ** the lock.
    */
    pInode->nShared--;
    if( pInode->nShared==0 ){
      lock.l_type = F_UNLCK;
      lock.l_whence = SEEK_SET;
      lock.l_start = lock.l_len = 0L;
      
      if( fcntl(h, F_SETLK, &lock)!=(-1) ){
        pInode->eFileLock = NO_LOCK;
      }else{
        tErrno = errno;
		rc = unqliteErrorFromPosixError(tErrno, UNQLITE_LOCKERR);
        if( IS_LOCK_ERROR(rc) ){
          pFile->lastErrno = tErrno;
        }
        pInode->eFileLock = NO_LOCK;
        pFile->eFileLock = NO_LOCK;
      }
    }

    /* Decrement the count of locks against this same file.  When the
    ** count reaches zero, close any other file descriptors whose close
    ** was deferred because of outstanding locks.
    */
    pInode->nLock--;
 
    if( pInode->nLock==0 ){
      int rc2 = closePendingFds(pFile);
      if( rc==UNQLITE_OK ){
        rc = rc2;
      }
    }
  }
	
end_unlock:

  unixLeaveMutex();
  
  if( rc==UNQLITE_OK ) pFile->eFileLock = eFileLock;
  return rc;
}